

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_mulw(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *s_00;
  TCGv_i32 arg;
  ea_what what;
  uintptr_t o;
  TCGTemp *a1;
  TCGv_i32 pTVar1;
  uintptr_t o_1;
  uintptr_t o_2;
  TCGv_i32 ret;
  
  s_00 = s->uc->tcg_ctx;
  arg = *(TCGv_i32 *)((long)s_00->cpu_dregs + (ulong)(insn >> 6 & 0x38));
  a1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a1 - (long)s_00);
  if ((insn >> 8 & 1) == 0) {
    tcg_gen_ext16u_i32_m68k(s_00,ret,arg);
    what = EA_LOADU;
  }
  else {
    tcg_gen_ext16s_i32_m68k(s_00,ret,arg);
    what = EA_LOADS;
  }
  pTVar1 = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,1,s_00->NULL_QREG,(TCGv_i32 *)0x0,what,
                       (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != s_00->NULL_QREG) {
    tcg_gen_op3_m68k(s_00,INDEX_op_mul_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)(pTVar1 + (long)s_00));
    if (arg != ret) {
      tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)(arg + (long)s_00),(TCGArg)a1);
    }
    gen_logic_cc(s,ret,2);
    tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
    return;
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(mulw)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv tmp;
    TCGv src;
    int sign;

    sign = (insn & 0x100) != 0;
    reg = DREG(insn, 9);
    tmp = tcg_temp_new(tcg_ctx);
    if (sign)
        tcg_gen_ext16s_i32(tcg_ctx, tmp, reg);
    else
        tcg_gen_ext16u_i32(tcg_ctx, tmp, reg);
    SRC_EA(env, src, OS_WORD, sign, NULL);
    tcg_gen_mul_i32(tcg_ctx, tmp, tmp, src);
    tcg_gen_mov_i32(tcg_ctx, reg, tmp);
    gen_logic_cc(s, tmp, OS_LONG);
    tcg_temp_free(tcg_ctx, tmp);
}